

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_SubDEdgePtr * __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::AppendNew(ON_SimpleArray<ON_SubDEdgePtr> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = this->m_count;
  if (uVar2 == this->m_capacity) {
    if ((int)uVar2 < 8 || (ulong)((long)(int)uVar2 << 3) < 0x10000001) {
      uVar3 = 4;
      if (2 < (int)uVar2) {
        uVar3 = uVar2 * 2;
      }
    }
    else {
      uVar3 = 0x2000008;
      if (uVar2 < 0x2000008) {
        uVar3 = uVar2;
      }
      uVar3 = uVar3 + uVar2;
    }
    if (uVar2 < uVar3) {
      SetCapacity(this,(long)(int)uVar3);
      uVar2 = this->m_count;
    }
  }
  this->m_a[(int)uVar2].m_ptr = 0;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}